

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

void SetLoopParams(VP8Encoder *enc,float q)

{
  int iVar1;
  int *piVar2;
  VP8MBInfo *pVVar3;
  WebPAuxStats *pWVar4;
  uint8_t uVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  int total;
  byte bVar11;
  int total_1;
  int iVar12;
  float fVar13;
  int p [4];
  undefined8 local_28;
  undefined8 uStack_20;
  
  fVar13 = 100.0;
  if (q <= 100.0) {
    fVar13 = q;
  }
  VP8SetSegmentParams(enc,(float)(~-(uint)(q < 0.0) & (uint)fVar13));
  local_28 = 0;
  uStack_20 = 0;
  uVar9 = enc->mb_h_ * enc->mb_w_;
  if (0 < (int)uVar9) {
    pVVar3 = enc->mb_info_;
    uVar10 = 0;
    do {
      piVar2 = (int *)((long)&local_28 + (ulong)(*(byte *)(pVVar3 + uVar10) >> 3 & 0xc));
      *piVar2 = *piVar2 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  pWVar4 = enc->pic_->stats;
  if (pWVar4 != (WebPAuxStats *)0x0) {
    *(undefined8 *)pWVar4->segment_size = local_28;
    *(undefined8 *)(pWVar4->segment_size + 2) = uStack_20;
  }
  if ((enc->segment_hdr_).num_segments_ < 2) {
    (enc->segment_hdr_).update_map_ = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = local_28._4_4_ + (int)local_28;
    iVar1 = uStack_20._4_4_ + (int)uStack_20;
    bVar8 = 0xff;
    bVar11 = 0xff;
    iVar12 = iVar1 + iVar6;
    if (iVar12 != 0) {
      bVar11 = (byte)((iVar12 / 2 + iVar6 * 0xff) / iVar12);
    }
    (enc->proba_).segments_[0] = bVar11;
    if (iVar6 != 0) {
      bVar8 = (byte)((iVar6 / 2 + (int)local_28 * 0xff) / iVar6);
    }
    (enc->proba_).segments_[1] = bVar8;
    if (iVar1 == 0) {
      uVar10 = 0xff;
    }
    else {
      uVar10 = (long)(iVar1 / 2 + (int)uStack_20 * 0xff) / (long)iVar1 & 0xffffffff;
    }
    uVar5 = (uint8_t)uVar10;
    (enc->proba_).segments_[2] = uVar5;
    if ((bVar11 == 0xff) && (bVar8 == 0xff)) {
      bVar8 = 0xff;
      (enc->segment_hdr_).update_map_ = (uint)(uVar5 != 0xff);
      if (uVar5 == 0xff) {
        bVar11 = 0xff;
        if (0 < enc->mb_h_ * enc->mb_w_) {
          lVar7 = 0;
          do {
            *(byte *)(enc->mb_info_ + lVar7) = *(byte *)(enc->mb_info_ + lVar7) & 0x9f;
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)enc->mb_h_ * (long)enc->mb_w_);
          bVar11 = (enc->proba_).segments_[0];
          bVar8 = (enc->proba_).segments_[1];
          uVar10 = (ulong)(enc->proba_).segments_[2];
        }
      }
      else {
        bVar11 = 0xff;
      }
    }
    else {
      (enc->segment_hdr_).update_map_ = 1;
    }
    iVar6 = ((uint)VP8EntropyCost[(byte)~(byte)uVar10] + (uint)VP8EntropyCost[(byte)~bVar11]) *
            uStack_20._4_4_ +
            ((uint)VP8EntropyCost[uVar10 & 0xff] + (uint)VP8EntropyCost[(byte)~bVar11]) *
            (int)uStack_20 +
            ((uint)VP8EntropyCost[(byte)~bVar8] + (uint)VP8EntropyCost[bVar11]) * local_28._4_4_ +
            ((uint)VP8EntropyCost[bVar8] + (uint)VP8EntropyCost[bVar11]) * (int)local_28;
  }
  (enc->segment_hdr_).size_ = iVar6;
  VP8CalculateLevelCosts(&enc->proba_);
  (enc->proba_).nb_skip_ = 0;
  enc->sse_count_ = 0;
  enc->sse_[0] = 0;
  enc->sse_[1] = 0;
  enc->sse_[2] = 0;
  return;
}

Assistant:

static void SetLoopParams(VP8Encoder* const enc, float q) {
  // Make sure the quality parameter is inside valid bounds
  q = Clamp(q, 0.f, 100.f);

  VP8SetSegmentParams(enc, q);      // setup segment quantizations and filters
  SetSegmentProbas(enc);            // compute segment probabilities

  ResetStats(enc);
  ResetSSE(enc);
}